

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O2

void __thiscall
Imath_3_2::Euler<float>::Euler(Euler<float> *this,Vec3<float> *v,Order p,InputLayout l)

{
  float fVar1;
  
  setOrder(this,p);
  if (l != XYZLayout) {
    fVar1 = v->y;
    (this->super_Vec3<float>).x = v->x;
    (this->super_Vec3<float>).y = fVar1;
    (this->super_Vec3<float>).z = v->z;
    return;
  }
  setXYZVector(this,v);
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Euler<T>::Euler (
    const Vec3<T>&                 v,
    typename Euler<T>::Order       p,
    typename Euler<T>::InputLayout l) IMATH_NOEXCEPT
{
    setOrder (p);
    if (l == XYZLayout)
        setXYZVector (v);
    else
    {
        x = v.x;
        y = v.y;
        z = v.z;
    }
}